

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<Catch::JunitReporter::Stats>::
construct<Catch::JunitReporter::Stats,Catch::JunitReporter::Stats>
          (new_allocator<Catch::JunitReporter::Stats> *this,Stats *__p,Stats *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  pointer pTVar8;
  
  __p->m_timeInSeconds = __args->m_timeInSeconds;
  sVar4 = __args->m_testsCount;
  sVar5 = __args->m_failuresCount;
  sVar6 = __args->m_errorsCount;
  __p->m_disabledCount = __args->m_disabledCount;
  __p->m_errorsCount = sVar6;
  __p->m_testsCount = sVar4;
  __p->m_failuresCount = sVar5;
  paVar1 = &(__p->m_name).field_2;
  (__p->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_name)._M_dataplus._M_p;
  paVar2 = &(__args->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&(__args->m_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_name).field_2 + 8) = uVar7;
  }
  else {
    (__p->m_name)._M_dataplus._M_p = pcVar3;
    (__p->m_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_name)._M_string_length = (__args->m_name)._M_string_length;
  (__args->m_name)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_name)._M_string_length = 0;
  (__args->m_name).field_2._M_local_buf[0] = '\0';
  pTVar8 = (__args->m_testCaseStats).
           super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->m_testCaseStats).
       super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = pTVar8;
  (__p->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->m_testCaseStats).
       super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->m_testCaseStats).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Stats( const std::string& name = std::string() )
            :   m_testsCount( 0 ),
                m_failuresCount( 0 ),
                m_disabledCount( 0 ),
                m_errorsCount( 0 ),
                m_timeInSeconds( 0 ),
                m_name( name )
            {}